

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void CChat::Com_Befriend(IResult *pResult,void *pContext)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  IFriends *pIVar6;
  long in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  bool IsFriend;
  CClientData *pTarget;
  int TargetID;
  CChat *pChatData;
  SCommandContext *pCommandContext;
  char aMsg [128];
  char *local_d8;
  CChat *in_stack_ffffffffffffff30;
  char *buffer;
  CGameClient *this;
  undefined7 in_stack_ffffffffffffff40;
  char local_88 [52];
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  CChat *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(in_RSI + 0x18);
  this = *(CGameClient **)(lVar2 + 8);
  (**(code **)(*in_RDI + 0x20))(in_RDI,0);
  iVar4 = CGameClient::GetClientID(this,(char *)in_stack_ffffffffffffff30);
  if (iVar4 != -1) {
    lVar5 = *(long *)(lVar2 + 8) + 0x4540 + (long)iVar4 * 0x5b0;
    bVar3 = *(byte *)(lVar5 + 0x5ae) & 1;
    if (bVar3 == 0) {
      pIVar6 = CGameClient::Friends(*(CGameClient **)(lVar2 + 8));
      (*(pIVar6->super_IInterface)._vptr_IInterface[7])(pIVar6,lVar5,lVar5 + 0x41);
    }
    else {
      pIVar6 = CGameClient::Friends(*(CGameClient **)(lVar2 + 8));
      (*(pIVar6->super_IInterface)._vptr_IInterface[8])(pIVar6,lVar5,lVar5 + 0x41);
    }
    *(bool *)(lVar5 + 0x5ae) = (*(byte *)(lVar5 + 0x5ae) & 1) != 1;
    ClearInput(in_stack_ffffffffffffff30);
    buffer = local_88;
    if ((bVar3 & 1) == 0) {
      local_d8 = Localize((char *)CONCAT17(bVar3,in_stack_ffffffffffffff40),(char *)this);
    }
    else {
      local_d8 = Localize((char *)CONCAT17(bVar3,in_stack_ffffffffffffff40),(char *)this);
    }
    str_format(buffer,0x80,local_d8,lVar5);
    AddLine(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
            in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  }
  Disable((CChat *)0x14c3ad);
  (**(code **)(**(long **)(lVar2 + 8) + 0xb8))();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChat::Com_Befriend(IConsole::IResult *pResult, void *pContext)
{
	CCommandManager::SCommandContext *pCommandContext = (CCommandManager::SCommandContext *)pContext;
	CChat *pChatData = (CChat *)pCommandContext->m_pContext;

	int TargetID = pChatData->m_pClient->GetClientID(pResult->GetString(0));
	if(TargetID != -1)
	{
		CGameClient::CClientData *pTarget = &pChatData->m_pClient->m_aClients[TargetID];
		bool IsFriend = pTarget->m_Friend;
		if(IsFriend)
			pChatData->m_pClient->Friends()->RemoveFriend(pTarget->m_aName, pTarget->m_aClan);
		else
			pChatData->m_pClient->Friends()->AddFriend(pTarget->m_aName, pTarget->m_aClan);
		pTarget->m_Friend ^= 1;

		pChatData->ClearInput();

		char aMsg[128];
		str_format(aMsg, sizeof(aMsg), !IsFriend ? Localize("'%s' was added as a friend") : Localize("'%s' was removed as a friend"), pTarget->m_aName);
		pChatData->AddLine(aMsg, CLIENT_MSG, CHAT_ALL);
	}
	pChatData->Disable();
	pChatData->m_pClient->OnRelease();
}